

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Instr * __thiscall GlobOpt::FindArraySegmentLoadInstr(GlobOpt *this,Instr *fromInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    fromInstr = fromInstr->m_prev;
    if (fromInstr == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x433d,"(headSegmentLengthLoad)","headSegmentLengthLoad");
      if (!bVar2) goto LAB_00443114;
      *puVar3 = 0;
    }
    if ((fromInstr->m_kind == InstrKindProfiledLabel) || (fromInstr->m_kind == InstrKindLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x433e,"(!headSegmentLengthLoad->IsLabelInstr())",
                         "!headSegmentLengthLoad->IsLabelInstr()");
      if (!bVar2) {
LAB_00443114:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    if (fromInstr->m_opcode == LdIndir) {
      return fromInstr;
    }
  } while( true );
}

Assistant:

IR::Instr*
GlobOpt::FindArraySegmentLoadInstr(IR::Instr* fromInstr)
{
    IR::Instr *headSegmentLengthLoad = fromInstr;
    do
    {
        headSegmentLengthLoad = headSegmentLengthLoad->m_prev;
        Assert(headSegmentLengthLoad);
        Assert(!headSegmentLengthLoad->IsLabelInstr());
    } while (headSegmentLengthLoad->m_opcode != Js::OpCode::LdIndir);
    return headSegmentLengthLoad;
}